

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

bool __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
::reentrant_consume_operation::start_consume_impl
          (reentrant_consume_operation *this,PrivateType param_1,
          conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
          *i_queue)

{
  bool bVar1;
  unique_lock<std::mutex> local_70;
  undefined1 local_60 [8];
  unique_lock<std::mutex> new_lock;
  unique_lock<std::mutex> local_40;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  *i_queue_local;
  PrivateType param_1_local;
  reentrant_consume_operation *this_local;
  
  lock._8_8_ = i_queue;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30);
  if (this->m_queue !=
      (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
       *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->m_queue->m_mutex);
    std::unique_lock<std::mutex>::operator=((unique_lock<std::mutex> *)local_30,&local_40);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_60);
  if ((this->m_queue !=
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)lock._8_8_) && (lock._8_8_ != 0)) {
    std::unique_lock<std::mutex>::unique_lock(&local_70,(mutex_type *)lock._8_8_);
    std::unique_lock<std::mutex>::operator=((unique_lock<std::mutex> *)local_60,&local_70);
    std::unique_lock<std::mutex>::~unique_lock(&local_70);
  }
  bVar1 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)&this->m_consume_operation);
  if (bVar1) {
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::cancel(&this->m_consume_operation);
  }
  std::unique_lock<std::mutex>::operator=
            ((unique_lock<std::mutex> *)local_30,(unique_lock<std::mutex> *)local_60);
  this->m_queue =
       (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)lock._8_8_;
  bVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
          ::try_start_reentrant_consume(&this->m_queue->m_queue,&this->m_consume_operation);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return bVar1;
}

Assistant:

bool start_consume_impl(PrivateType, conc_heter_queue * i_queue)
            {
                DENSITY_ASSUME(i_queue != nullptr);

                // first we take the locks, because they may throw
                std::unique_lock<std::mutex> lock;
                if (m_queue != nullptr)
                {
                    lock = std::unique_lock<std::mutex>(m_queue->m_mutex);
                }
                std::unique_lock<std::mutex> new_lock;
                if (m_queue != i_queue && i_queue != nullptr)
                {
                    new_lock = std::unique_lock<std::mutex>(i_queue->m_mutex);
                }

                // nothing can throw from now on
                if (m_consume_operation)
                    m_consume_operation.cancel();
                lock    = std::move(new_lock);
                m_queue = i_queue;
                return m_queue->m_queue.try_start_reentrant_consume(m_consume_operation);
            }